

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate)

{
  REF_GRID pRVar1;
  REF_NODE pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int cell;
  int iVar8;
  REF_CELL ref_cell;
  REF_INT nodes [27];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  
  pRVar1 = ref_migrate->grid;
  ref_cell = pRVar1->cell[10];
  if (0 < ref_cell->max) {
    pRVar2 = pRVar1->node;
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,cell,&local_a8);
      if (RVar3 == 0) {
        lVar5 = -1;
        lVar7 = -1;
        if (((-1 < (long)local_a8) && (local_a8 < pRVar2->max)) &&
           (lVar7 = pRVar2->global[local_a8], lVar7 < 0)) {
          lVar7 = -1;
        }
        if (((-1 < (long)local_9c) && (local_9c < pRVar2->max)) &&
           (lVar5 = pRVar2->global[local_9c], lVar5 < 0)) {
          lVar5 = -1;
        }
        iVar6 = local_9c;
        iVar8 = local_a8;
        if (lVar5 <= lVar7) {
          iVar6 = local_a8;
          iVar8 = local_9c;
        }
        uVar4 = ref_migrate_2d_agglomeration_keep(ref_migrate,iVar8,iVar6);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xf2,"ref_migrate_2d_agglomeration",(ulong)uVar4,"0-3");
          return uVar4;
        }
        lVar5 = -1;
        lVar7 = -1;
        if (((-1 < (long)local_a4) && (local_a4 < pRVar2->max)) &&
           (lVar7 = pRVar2->global[local_a4], lVar7 < 0)) {
          lVar7 = -1;
        }
        if (((-1 < (long)local_98) && (local_98 < pRVar2->max)) &&
           (lVar5 = pRVar2->global[local_98], lVar5 < 0)) {
          lVar5 = -1;
        }
        iVar6 = local_98;
        iVar8 = local_a4;
        if (lVar5 <= lVar7) {
          iVar6 = local_a4;
          iVar8 = local_98;
        }
        uVar4 = ref_migrate_2d_agglomeration_keep(ref_migrate,iVar8,iVar6);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0xfc,"ref_migrate_2d_agglomeration",(ulong)uVar4,"1-4");
          return uVar4;
        }
        lVar5 = -1;
        lVar7 = -1;
        if (((-1 < (long)local_a0) && (local_a0 < pRVar2->max)) &&
           (lVar7 = pRVar2->global[local_a0], lVar7 < 0)) {
          lVar7 = -1;
        }
        if (((-1 < (long)local_94) && (local_94 < pRVar2->max)) &&
           (lVar5 = pRVar2->global[local_94], lVar5 < 0)) {
          lVar5 = -1;
        }
        iVar6 = local_94;
        iVar8 = local_a0;
        if (lVar5 <= lVar7) {
          iVar6 = local_a0;
          iVar8 = local_94;
        }
        uVar4 = ref_migrate_2d_agglomeration_keep(ref_migrate,iVar8,iVar6);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x106,"ref_migrate_2d_agglomeration",(ulong)uVar4,"2-5");
          return uVar4;
        }
      }
      cell = cell + 1;
      ref_cell = pRVar1->cell[10];
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate) {
  REF_GRID ref_grid = ref_migrate_grid(ref_migrate);
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT keep, lose;

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    if (ref_node_global(ref_node, nodes[0]) <
        ref_node_global(ref_node, nodes[3])) {
      keep = nodes[0];
      lose = nodes[3];
    } else {
      keep = nodes[3];
      lose = nodes[0];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "0-3");

    if (ref_node_global(ref_node, nodes[1]) <
        ref_node_global(ref_node, nodes[4])) {
      keep = nodes[1];
      lose = nodes[4];
    } else {
      keep = nodes[4];
      lose = nodes[1];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "1-4");

    if (ref_node_global(ref_node, nodes[2]) <
        ref_node_global(ref_node, nodes[5])) {
      keep = nodes[2];
      lose = nodes[5];
    } else {
      keep = nodes[5];
      lose = nodes[2];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "2-5");
  }

  return REF_SUCCESS;
}